

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessor_case.cc
# Opt level: O0

string_view google::protobuf::compiler::rust::ViewReceiver(AccessorCase accessor_case)

{
  undefined1 auStack_18 [4];
  AccessorCase accessor_case_local;
  
  if (accessor_case < VIEW) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,"&self");
  }
  else if (accessor_case == VIEW) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,"self");
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,"");
  }
  return _auStack_18;
}

Assistant:

absl::string_view ViewReceiver(AccessorCase accessor_case) {
  switch (accessor_case) {
    case AccessorCase::VIEW:
      return "self";
    case AccessorCase::OWNED:
    case AccessorCase::MUT:
      return "&self";
  }
  return "";
}